

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-utils.h
# Opt level: O2

void __thiscall anon_func::Mapper::~Mapper(Mapper *this)

{
  ~Mapper(this);
  operator_delete(this,0x138);
  return;
}

Assistant:

bool modifiesBinaryenIR() override { return Mut; }